

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPass.cpp
# Opt level: O0

SubpassAttachmentHandle __thiscall
myvk::RenderPassState::SubpassAttachmentHandle::SetDepthStencilAttachment
          (SubpassAttachmentHandle *this,char *attachment_str,VkImageLayout layout,
          char *src_subpass_str,VkPipelineStageFlags src_stage,VkPipelineStageFlags use_stage,
          VkAccessFlags src_access,VkAccessFlags use_access,VkDependencyFlags dependency_flag)

{
  VkAttachmentReference VVar1;
  uint32_t uVar2;
  reference pvVar3;
  reference pvVar4;
  VkImageLayout in_EDX;
  undefined1 (*in_RDI) [12];
  SubpassAttachmentHandle SVar5;
  VkAccessFlags in_stack_0000000c;
  VkPipelineStageFlags in_stack_00000010;
  VkPipelineStageFlags in_stack_00000014;
  uint32_t in_stack_00000018;
  uint32_t in_stack_0000001c;
  RenderPassState *in_stack_00000020;
  value_type *des;
  value_type *info;
  undefined1 (*attachment_str_00) [12];
  RenderPassState *in_stack_ffffffffffffffe8;
  
  attachment_str_00 = in_RDI;
  pvVar3 = std::
           vector<myvk::RenderPassState::SubpassInfo,_std::allocator<myvk::RenderPassState::SubpassInfo>_>
           ::operator[]((vector<myvk::RenderPassState::SubpassInfo,_std::allocator<myvk::RenderPassState::SubpassInfo>_>
                         *)(*(long *)*in_RDI + 0x78),(ulong)*(uint *)(*in_RDI + 8));
  pvVar4 = std::vector<VkSubpassDescription,_std::allocator<VkSubpassDescription>_>::operator[]
                     ((vector<VkSubpassDescription,_std::allocator<VkSubpassDescription>_> *)
                      (*(long *)*in_RDI + 0x90),(ulong)*(uint *)(*in_RDI + 8));
  uVar2 = get_attachment(in_stack_ffffffffffffffe8,(char *)attachment_str_00);
  VVar1.layout = in_EDX;
  VVar1.attachment = uVar2;
  pvVar3->depth_stencil_attachment_reference = VVar1;
  pvVar4->pDepthStencilAttachment = &pvVar3->depth_stencil_attachment_reference;
  get_subpass(in_stack_ffffffffffffffe8,(char *)attachment_str_00);
  insert_subpass_dependency
            (in_stack_00000020,in_stack_0000001c,in_stack_00000018,in_stack_00000014,
             in_stack_00000010,in_stack_0000000c,(VkAccessFlags)info,use_stage);
  SVar5._12_4_ = 0;
  SVar5._0_12_ = *in_RDI;
  return SVar5;
}

Assistant:

RenderPassState::SubpassAttachmentHandle RenderPassState::SubpassAttachmentHandle::SetDepthStencilAttachment(
    const char *attachment_str, VkImageLayout layout, const char *src_subpass_str, VkPipelineStageFlags src_stage,
    VkPipelineStageFlags use_stage, VkAccessFlags src_access, VkAccessFlags use_access,
    VkDependencyFlags dependency_flag) {
	auto &info = m_state_ptr->m_subpass_infos[m_subpass];
	auto &des = m_state_ptr->m_subpass_descriptions[m_subpass];
	assert(des.pDepthStencilAttachment == nullptr);

	info.depth_stencil_attachment_reference = {m_state_ptr->get_attachment(attachment_str), layout};
	des.pDepthStencilAttachment = &(info.depth_stencil_attachment_reference);

	m_state_ptr->insert_subpass_dependency(m_state_ptr->get_subpass(src_subpass_str), m_subpass, src_stage, use_stage,
	                                       src_access, use_access, dependency_flag);
	return *this;
}